

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

void __thiscall
fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::
padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
::operator()(padded_int_writer<fmt::v6::internal::basic_writer<fmt::v6::buffer_range<wchar_t>>::int_writer<unsigned__int128,fmt::v6::basic_format_specs<wchar_t>>::bin_writer<3>>
             *this,wchar_t **it)

{
  wchar_t wVar1;
  long lVar2;
  ulong uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  wchar_t *pwVar7;
  wchar_t *pwVar8;
  ulong uVar9;
  char *pcVar10;
  long lVar11;
  ulong uVar12;
  bool bVar13;
  bool bVar14;
  int iVar16;
  undefined1 auVar15 [16];
  undefined1 auVar17 [16];
  int iVar19;
  undefined1 auVar18 [16];
  
  pwVar7 = *it;
  if (0 < *(long *)(this + 0x10)) {
    pcVar10 = *(char **)(this + 8);
    uVar9 = *(long *)(this + 0x10) + 1;
    do {
      *pwVar7 = (int)*pcVar10;
      pcVar10 = pcVar10 + 1;
      pwVar7 = pwVar7 + 1;
      uVar9 = uVar9 - 1;
    } while (1 < uVar9);
  }
  auVar6 = _DAT_0019b840;
  auVar5 = _DAT_00198c30;
  auVar4 = _DAT_00196020;
  lVar2 = *(long *)(this + 0x20);
  pwVar8 = pwVar7;
  if (lVar2 != 0) {
    pwVar8 = pwVar7 + lVar2;
    wVar1 = *(wchar_t *)(this + 0x18);
    uVar9 = lVar2 + 0x3fffffffffffffffU & 0x3fffffffffffffff;
    auVar15._8_4_ = (int)uVar9;
    auVar15._0_8_ = uVar9;
    auVar15._12_4_ = (int)(uVar9 >> 0x20);
    lVar11 = 0;
    auVar15 = auVar15 ^ _DAT_00196020;
    do {
      auVar17._8_4_ = (int)lVar11;
      auVar17._0_8_ = lVar11;
      auVar17._12_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar18 = (auVar17 | auVar5) ^ auVar4;
      iVar16 = auVar15._4_4_;
      if ((bool)(~(auVar18._4_4_ == iVar16 && auVar15._0_4_ < auVar18._0_4_ ||
                  iVar16 < auVar18._4_4_) & 1)) {
        pwVar7[lVar11] = wVar1;
      }
      if ((auVar18._12_4_ != auVar15._12_4_ || auVar18._8_4_ <= auVar15._8_4_) &&
          auVar18._12_4_ <= auVar15._12_4_) {
        pwVar7[lVar11 + 1] = wVar1;
      }
      auVar17 = (auVar17 | auVar6) ^ auVar4;
      iVar19 = auVar17._4_4_;
      if (iVar19 <= iVar16 && (iVar19 != iVar16 || auVar17._0_4_ <= auVar15._0_4_)) {
        pwVar7[lVar11 + 2] = wVar1;
        pwVar7[lVar11 + 3] = wVar1;
      }
      lVar11 = lVar11 + 4;
    } while ((uVar9 - ((uint)(lVar2 + 0x3fffffffffffffffU) & 3)) + 4 != lVar11);
  }
  iVar16 = *(int *)(this + 0x40);
  pwVar7 = pwVar8 + iVar16;
  uVar9 = *(ulong *)(this + 0x30);
  uVar12 = *(ulong *)(this + 0x38);
  do {
    pwVar7 = pwVar7 + -1;
    *pwVar7 = (uint)uVar9 & 7 | 0x30;
    bVar13 = 7 < uVar9;
    bVar14 = uVar12 != 0;
    uVar3 = -uVar12;
    uVar9 = uVar12 << 0x3d | uVar9 >> 3;
    uVar12 = uVar12 >> 3;
  } while (bVar14 || uVar3 < bVar13);
  *it = pwVar8 + iVar16;
  return;
}

Assistant:

FMT_CONSTEXPR size_t size() const { return size_; }